

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.h
# Opt level: O1

void __thiscall
re2::ExhaustiveTester::ExhaustiveTester
          (ExhaustiveTester *this,int maxatoms,int maxops,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *alphabet,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ops,int maxstrlen,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stralphabet,string *wrapper,string *topwrapper)

{
  pointer pcVar1;
  
  RegexpGenerator::RegexpGenerator(&this->super_RegexpGenerator,maxatoms,maxops,alphabet,ops);
  (this->super_RegexpGenerator)._vptr_RegexpGenerator =
       (_func_int **)&PTR__ExhaustiveTester_001571d0;
  StringGenerator::StringGenerator(&this->strgen_,maxstrlen,stralphabet);
  (this->wrapper_)._M_dataplus._M_p = (pointer)&(this->wrapper_).field_2;
  pcVar1 = (wrapper->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->wrapper_,pcVar1,pcVar1 + wrapper->_M_string_length);
  (this->topwrapper_)._M_dataplus._M_p = (pointer)&(this->topwrapper_).field_2;
  pcVar1 = (topwrapper->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->topwrapper_,pcVar1,pcVar1 + topwrapper->_M_string_length);
  this->stringseed_ = 0;
  this->stringcount_ = 0;
  this->regexps_ = 0;
  this->tests_ = 0;
  *(undefined8 *)((long)&this->tests_ + 1) = 0;
  return;
}

Assistant:

ExhaustiveTester(int maxatoms,
                   int maxops,
                   const vector<string>& alphabet,
                   const vector<string>& ops,
                   int maxstrlen,
                   const vector<string>& stralphabet,
                   const string& wrapper,
                   const string& topwrapper)
    : RegexpGenerator(maxatoms, maxops, alphabet, ops),
      strgen_(maxstrlen, stralphabet),
      wrapper_(wrapper),
      topwrapper_(topwrapper),
      regexps_(0), tests_(0), failures_(0),
      randomstrings_(0), stringseed_(0), stringcount_(0)  { }